

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonAppendValue(JsonString *p,sqlite3_value *pValue)

{
  byte bVar1;
  u32 N;
  uchar *zIn;
  Mem *pMem;
  
  bVar1 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
          [pValue->flags & 0x1f];
  if (bVar1 - 1 < 2) {
    zIn = sqlite3_value_text(pValue);
    N = sqlite3_value_bytes(pValue);
  }
  else if (bVar1 == 3) {
    zIn = sqlite3_value_text(pValue);
    N = sqlite3_value_bytes(pValue);
    if ((-1 < (short)pValue->flags) || (pValue->eSubtype != 'J')) {
      jsonAppendString(p,(char *)zIn,N);
      return;
    }
  }
  else {
    if (bVar1 != 5) {
      if (p->bErr == '\0') {
        sqlite3_result_error(p->pCtx,"JSON cannot hold BLOB values",-1);
        p->bErr = '\x02';
        jsonReset(p);
        return;
      }
      return;
    }
    zIn = "null";
    N = 4;
  }
  jsonAppendRaw(p,(char *)zIn,N);
  return;
}

Assistant:

static void jsonAppendValue(
  JsonString *p,                 /* Append to this JSON string */
  sqlite3_value *pValue          /* Value to append */
){
  switch( sqlite3_value_type(pValue) ){
    case SQLITE_NULL: {
      jsonAppendRaw(p, "null", 4);
      break;
    }
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      jsonAppendRaw(p, z, n);
      break;
    }
    case SQLITE_TEXT: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      if( sqlite3_value_subtype(pValue)==JSON_SUBTYPE ){
        jsonAppendRaw(p, z, n);
      }else{
        jsonAppendString(p, z, n);
      }
      break;
    }
    default: {
      if( p->bErr==0 ){
        sqlite3_result_error(p->pCtx, "JSON cannot hold BLOB values", -1);
        p->bErr = 2;
        jsonReset(p);
      }
      break;
    }
  }
}